

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtSphereBoxCollisionAlgorithm.cpp
# Opt level: O3

bool __thiscall
cbtSphereBoxCollisionAlgorithm::getSphereDistance
          (cbtSphereBoxCollisionAlgorithm *this,cbtCollisionObjectWrapper *boxObjWrap,
          cbtVector3 *pointOnBox,cbtVector3 *normal,cbtScalar *penetrationDepth,
          cbtVector3 *sphereCenter,cbtScalar fRadius,cbtScalar maxContactDistance)

{
  uint uVar1;
  cbtScalar cVar2;
  undefined8 uVar3;
  ulong uVar4;
  cbtSphereBoxCollisionAlgorithm *pcVar5;
  cbtTransform *pcVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  cbtSphereBoxCollisionAlgorithm *this_00;
  undefined1 auVar15 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar21 [64];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [12];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  cbtScalar cVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  float fVar37;
  cbtVector3 local_78;
  undefined1 local_68 [16];
  cbtVector3 local_58;
  undefined1 local_48 [16];
  undefined1 extraout_var [60];
  
  auVar21._4_60_ = in_register_00001204;
  auVar21._0_4_ = fRadius;
  auVar32 = auVar21._0_16_;
  pcVar5 = (cbtSphereBoxCollisionAlgorithm *)boxObjWrap->m_shape;
  local_68._0_4_ = maxContactDistance;
  this_00 = pcVar5;
  (*(pcVar5->super_cbtActivatingCollisionAlgorithm).super_cbtCollisionAlgorithm.
    _vptr_cbtCollisionAlgorithm[0xc])();
  *penetrationDepth = 1.0;
  fVar7 = auVar32._0_4_ + fRadius;
  pcVar6 = boxObjWrap->m_worldTransform;
  fVar8 = fVar7 + (float)local_68._0_4_;
  fVar37 = sphereCenter->m_floats[1] - (pcVar6->m_origin).m_floats[1];
  fVar10 = sphereCenter->m_floats[0] - (pcVar6->m_origin).m_floats[0];
  fVar11 = sphereCenter->m_floats[2] - (pcVar6->m_origin).m_floats[2];
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar37 * (pcVar6->m_basis).m_el[1].m_floats[2])),
                            ZEXT416((uint)fVar10),
                            ZEXT416((uint)(pcVar6->m_basis).m_el[0].m_floats[2]));
  fVar8 = fVar8 * fVar8;
  auVar13 = vfmadd231ss_fma(auVar15,ZEXT416((uint)fVar11),
                            ZEXT416((uint)(pcVar6->m_basis).m_el[2].m_floats[2]));
  auVar15._4_4_ = fVar10;
  auVar15._0_4_ = fVar10;
  auVar15._8_4_ = fVar10;
  auVar15._12_4_ = fVar10;
  auVar28._4_4_ = fVar11;
  auVar28._0_4_ = fVar11;
  auVar28._8_4_ = fVar11;
  auVar28._12_4_ = fVar11;
  auVar30._4_8_ = SUB128(ZEXT812(0),4);
  auVar30._0_4_ = auVar13._0_4_;
  auVar30._12_4_ = 0;
  local_58.m_floats._8_8_ = vmovlps_avx(auVar30);
  uVar3 = *(undefined8 *)(pcVar6->m_basis).m_el[1].m_floats;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = *(ulong *)(pcVar6->m_basis).m_el[0].m_floats;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(pcVar6->m_basis).m_el[2].m_floats;
  auVar23._0_4_ = fVar37 * (float)uVar3;
  auVar23._4_4_ = fVar37 * (float)((ulong)uVar3 >> 0x20);
  auVar23._8_4_ = fVar37 * 0.0;
  auVar23._12_4_ = fVar37 * 0.0;
  auVar15 = vfmadd213ps_fma(auVar15,auVar31,auVar23);
  auVar23 = vfmadd213ps_fma(auVar28,auVar36,auVar15);
  local_58.m_floats._0_8_ = vmovlps_avx(auVar23);
  uVar4 = *(ulong *)((long)&pcVar5[1].super_cbtActivatingCollisionAlgorithm.
                            super_cbtCollisionAlgorithm._vptr_cbtCollisionAlgorithm + 4);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = uVar4;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = local_58.m_floats._0_8_;
  auVar15 = vminps_avx(auVar16,auVar24);
  auVar17._0_8_ = uVar4 ^ 0x8000000080000000;
  auVar17._8_4_ = 0x80000000;
  auVar17._12_4_ = 0x80000000;
  auVar18 = vmaxps_avx(auVar17,auVar15);
  local_78.m_floats._0_8_ = vmovlps_avx(auVar18);
  uVar1 = *(uint *)((long)&pcVar5[1].super_cbtActivatingCollisionAlgorithm.
                           super_cbtCollisionAlgorithm.m_dispatcher + 4);
  local_78.m_floats[2] = local_58.m_floats[2];
  auVar15 = vminss_avx(ZEXT416(uVar1),ZEXT416((uint)local_78.m_floats[2]));
  auVar25._0_4_ = uVar1 ^ 0x80000000;
  auVar25._4_4_ = 0x80000000;
  auVar25._8_4_ = 0x80000000;
  auVar25._12_4_ = 0x80000000;
  auVar23 = vsubps_avx(auVar23,auVar18);
  auVar15 = vmaxss_avx(auVar25,auVar15);
  local_78.m_floats[2] = auVar15._0_4_;
  fVar37 = auVar23._0_4_;
  auVar35._0_4_ = fVar37 * fVar37;
  fVar10 = auVar23._4_4_;
  auVar35._4_4_ = fVar10 * fVar10;
  fVar11 = auVar23._8_4_;
  auVar35._8_4_ = fVar11 * fVar11;
  fVar9 = auVar23._12_4_;
  auVar35._12_4_ = fVar9 * fVar9;
  fVar12 = auVar13._0_4_ - local_78.m_floats[2];
  local_78.m_floats[3] = local_58.m_floats[3];
  auVar15 = vmovshdup_avx(auVar35);
  auVar13 = vfmadd231ss_fma(auVar15,auVar23,auVar23);
  auVar15 = vinsertps_avx(auVar23,ZEXT416((uint)fVar12),0x28);
  *(undefined1 (*) [16])normal->m_floats = auVar15;
  local_68 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar12),ZEXT416((uint)fVar12));
  fVar34 = local_68._0_4_;
  if (fVar34 <= fVar8) {
    local_48 = auVar32;
    if (fVar34 <= 1.1920929e-07) {
      auVar22._0_4_ =
           getSpherePenetration
                     (this_00,(cbtVector3 *)
                              ((long)&pcVar5[1].super_cbtActivatingCollisionAlgorithm.
                                      super_cbtCollisionAlgorithm._vptr_cbtCollisionAlgorithm + 4),
                      &local_58,&local_78,normal);
      auVar22._4_60_ = extraout_var;
      auVar13._8_4_ = 0x80000000;
      auVar13._0_8_ = 0x8000000080000000;
      auVar13._12_4_ = 0x80000000;
      auVar15 = vxorps_avx512vl(auVar22._0_16_,auVar13);
      fVar27 = auVar15._0_4_;
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(ulong *)normal->m_floats;
      cVar33 = normal->m_floats[2];
      auVar18._8_8_ = 0;
      auVar18._0_4_ = local_78.m_floats[0];
      auVar18._4_4_ = local_78.m_floats[1];
    }
    else {
      auVar15 = vsqrtss_avx(local_68,local_68);
      fVar27 = auVar15._0_4_;
      fVar34 = 1.0 / fVar27;
      cVar33 = fVar12 * fVar34;
      auVar32._0_4_ = fVar37 * fVar34;
      auVar32._4_4_ = fVar10 * fVar34;
      auVar32._8_4_ = fVar11 * fVar34;
      auVar32._12_4_ = fVar9 * fVar34;
      uVar3 = vmovlps_avx(auVar32);
      *(undefined8 *)normal->m_floats = uVar3;
      normal->m_floats[2] = cVar33;
    }
    fVar34 = local_68._0_4_;
    fVar37 = local_48._0_4_;
    auVar19._0_4_ = fVar37 * auVar32._0_4_ + auVar18._0_4_;
    auVar19._4_4_ = fVar37 * auVar32._4_4_ + auVar18._4_4_;
    auVar19._8_4_ = fVar37 * auVar32._8_4_ + auVar18._8_4_;
    auVar19._12_4_ = fVar37 * auVar32._12_4_ + auVar18._12_4_;
    auVar15 = vinsertps_avx(auVar19,ZEXT416((uint)(fVar37 * cVar33 + local_78.m_floats[2])),0x28);
    *(undefined1 (*) [16])pointOnBox->m_floats = auVar15;
    *penetrationDepth = fVar27 - fVar7;
    fVar7 = pointOnBox->m_floats[1];
    cVar33 = pointOnBox->m_floats[0];
    cVar2 = pointOnBox->m_floats[2];
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * (pcVar6->m_basis).m_el[0].m_floats[1])),
                              ZEXT416((uint)cVar33),
                              ZEXT416((uint)(pcVar6->m_basis).m_el[0].m_floats[0]));
    auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * (pcVar6->m_basis).m_el[1].m_floats[1])),
                              ZEXT416((uint)cVar33),
                              ZEXT416((uint)(pcVar6->m_basis).m_el[1].m_floats[0]));
    auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * (pcVar6->m_basis).m_el[2].m_floats[1])),
                              ZEXT416((uint)cVar33),
                              ZEXT416((uint)(pcVar6->m_basis).m_el[2].m_floats[0]));
    auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)cVar2),
                              ZEXT416((uint)(pcVar6->m_basis).m_el[0].m_floats[2]));
    auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)cVar2),
                              ZEXT416((uint)(pcVar6->m_basis).m_el[1].m_floats[2]));
    auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)cVar2),
                              ZEXT416((uint)(pcVar6->m_basis).m_el[2].m_floats[2]));
    auVar15 = vinsertps_avx(ZEXT416((uint)(auVar15._0_4_ + (pcVar6->m_origin).m_floats[0])),
                            ZEXT416((uint)(auVar18._0_4_ + (pcVar6->m_origin).m_floats[1])),0x10);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = SUB648(ZEXT6064((undefined1  [60])0x0),4);
    auVar29 = SUB1612(auVar14 << 0x40,4);
    auVar26._4_12_ = auVar29;
    auVar26._0_4_ = auVar23._0_4_ + (pcVar6->m_origin).m_floats[2];
    uVar3 = vmovlps_avx(auVar15);
    *(undefined8 *)pointOnBox->m_floats = uVar3;
    uVar3 = vmovlps_avx(auVar26);
    *(undefined8 *)(pointOnBox->m_floats + 2) = uVar3;
    fVar7 = normal->m_floats[1];
    cVar33 = normal->m_floats[0];
    cVar2 = normal->m_floats[2];
    auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * (pcVar6->m_basis).m_el[0].m_floats[1])),
                              ZEXT416((uint)cVar33),
                              ZEXT416((uint)(pcVar6->m_basis).m_el[0].m_floats[0]));
    auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * (pcVar6->m_basis).m_el[1].m_floats[1])),
                              ZEXT416((uint)cVar33),
                              ZEXT416((uint)(pcVar6->m_basis).m_el[1].m_floats[0]));
    auVar23 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * (pcVar6->m_basis).m_el[2].m_floats[1])),
                              ZEXT416((uint)cVar33),
                              ZEXT416((uint)(pcVar6->m_basis).m_el[2].m_floats[0]));
    auVar23 = vfmadd231ss_fma(auVar23,ZEXT416((uint)cVar2),
                              ZEXT416((uint)(pcVar6->m_basis).m_el[2].m_floats[2]));
    auVar15 = vfmadd231ss_fma(auVar15,ZEXT416((uint)cVar2),
                              ZEXT416((uint)(pcVar6->m_basis).m_el[0].m_floats[2]));
    auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)cVar2),
                              ZEXT416((uint)(pcVar6->m_basis).m_el[1].m_floats[2]));
    auVar15 = vinsertps_avx(auVar15,auVar18,0x10);
    auVar20._4_12_ = auVar29;
    auVar20._0_4_ = auVar23._0_4_;
    uVar3 = vmovlps_avx(auVar15);
    *(undefined8 *)normal->m_floats = uVar3;
    uVar3 = vmovlps_avx(auVar20);
    *(undefined8 *)(normal->m_floats + 2) = uVar3;
  }
  return fVar34 <= fVar8;
}

Assistant:

bool cbtSphereBoxCollisionAlgorithm::getSphereDistance(const cbtCollisionObjectWrapper* boxObjWrap, cbtVector3& pointOnBox, cbtVector3& normal, cbtScalar& penetrationDepth, const cbtVector3& sphereCenter, cbtScalar fRadius, cbtScalar maxContactDistance)
{
	const cbtBoxShape* boxShape = (const cbtBoxShape*)boxObjWrap->getCollisionShape();
	cbtVector3 const& boxHalfExtent = boxShape->getHalfExtentsWithoutMargin();
	cbtScalar boxMargin = boxShape->getMargin();
	penetrationDepth = 1.0f;

	// convert the sphere position to the box's local space
	cbtTransform const& m44T = boxObjWrap->getWorldTransform();
	cbtVector3 sphereRelPos = m44T.invXform(sphereCenter);

	// Determine the closest point to the sphere center in the box
	cbtVector3 closestPoint = sphereRelPos;
	closestPoint.setX(cbtMin(boxHalfExtent.getX(), closestPoint.getX()));
	closestPoint.setX(cbtMax(-boxHalfExtent.getX(), closestPoint.getX()));
	closestPoint.setY(cbtMin(boxHalfExtent.getY(), closestPoint.getY()));
	closestPoint.setY(cbtMax(-boxHalfExtent.getY(), closestPoint.getY()));
	closestPoint.setZ(cbtMin(boxHalfExtent.getZ(), closestPoint.getZ()));
	closestPoint.setZ(cbtMax(-boxHalfExtent.getZ(), closestPoint.getZ()));

	cbtScalar intersectionDist = fRadius + boxMargin;
	cbtScalar contactDist = intersectionDist + maxContactDistance;
	normal = sphereRelPos - closestPoint;

	//if there is no penetration, we are done
	cbtScalar dist2 = normal.length2();
	if (dist2 > contactDist * contactDist)
	{
		return false;
	}

	cbtScalar distance;

	//special case if the sphere center is inside the box
	if (dist2 <= SIMD_EPSILON)
	{
		distance = -getSpherePenetration(boxHalfExtent, sphereRelPos, closestPoint, normal);
	}
	else  //compute the penetration details
	{
		distance = normal.length();
		normal /= distance;
	}

	pointOnBox = closestPoint + normal * boxMargin;
	//	v3PointOnSphere = sphereRelPos - (normal * fRadius);
	penetrationDepth = distance - intersectionDist;

	// transform back in world space
	cbtVector3 tmp = m44T(pointOnBox);
	pointOnBox = tmp;
	//	tmp = m44T(v3PointOnSphere);
	//	v3PointOnSphere = tmp;
	tmp = m44T.getBasis() * normal;
	normal = tmp;

	return true;
}